

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O2

wchar_t sftp_cmd_mv(sftp_command *cmd)

{
  _Bool _Var1;
  _Bool _Var2;
  char *fname;
  sftp_request *req;
  sftp_packet *pktin;
  wchar_t wVar3;
  ulong uVar4;
  sftp_context_mv ctx [1];
  fxp_attrs attrs;
  
  if (backend == (Backend *)0x0) {
    not_connected();
  }
  else if (cmd->nwords < 3) {
    puts("mv: expects two filenames");
  }
  else {
    fname = canonify(cmd->words[cmd->nwords - 1]);
    ctx[0].dstfname = fname;
    req = fxp_stat_send(fname);
    pktin = sftp_wait_for_reply(req);
    _Var1 = fxp_stat_recv(pktin,req,&attrs);
    if (((!_Var1) || (((byte)attrs.flags & 4) == 0)) ||
       (_Var1 = true, (attrs.permissions._1_1_ & 0x40) == 0)) {
      _Var1 = false;
    }
    ctx[0].dest_is_dir = _Var1;
    if (((cmd->nwords < 4) && (_Var2 = is_wildcard(cmd->words[1]), !_Var2)) || (_Var1 != false)) {
      wVar3 = L'\x01';
      for (uVar4 = 1; uVar4 < cmd->nwords - 1; uVar4 = uVar4 + 1) {
        _Var1 = wildcard_iterate(cmd->words[uVar4],sftp_action_mv,ctx);
        wVar3 = wVar3 & (uint)_Var1;
      }
      safefree(ctx[0].dstfname);
      return wVar3;
    }
    puts("mv: multiple or wildcard arguments require the destination to be a directory");
    safefree(fname);
  }
  return L'\0';
}

Assistant:

int sftp_cmd_mv(struct sftp_command *cmd)
{
    struct sftp_context_mv ctx[1];
    int i, ret;

    if (!backend) {
        not_connected();
        return 0;
    }

    if (cmd->nwords < 3) {
        printf("mv: expects two filenames\n");
        return 0;
    }

    ctx->dstfname = canonify(cmd->words[cmd->nwords-1]);

    /*
     * If there's more than one source argument, or one source
     * argument which is a wildcard, we _require_ that the
     * destination is a directory.
     */
    ctx->dest_is_dir = check_is_dir(ctx->dstfname);
    if ((cmd->nwords > 3 || is_wildcard(cmd->words[1])) && !ctx->dest_is_dir) {
        printf("mv: multiple or wildcard arguments require the destination"
               " to be a directory\n");
        sfree(ctx->dstfname);
        return 0;
    }

    /*
     * Now iterate over the source arguments.
     */
    ret = 1;
    for (i = 1; i < cmd->nwords-1; i++)
        ret &= wildcard_iterate(cmd->words[i], sftp_action_mv, ctx);

    sfree(ctx->dstfname);
    return ret;
}